

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O3

bool __thiscall
ON_OBSOLETE_V5_TextExtra::Read(ON_OBSOLETE_V5_TextExtra *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  int major_version;
  int minor_version;
  int local_20 [2];
  
  local_20[0] = 1;
  local_20[1] = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,local_20,local_20 + 1);
  if (!bVar1) {
    return false;
  }
  if (local_20[0] == 1) {
    bVar1 = ON_BinaryArchive::ReadUuid(archive,&this->m_parent_uuid);
    if ((((bVar1) && (bVar1 = ON_BinaryArchive::ReadBool(archive,&this->m_bDrawMask), bVar1)) &&
        (bVar1 = ON_BinaryArchive::ReadInt(archive,&this->m_color_source), bVar1)) &&
       (bVar1 = ON_BinaryArchive::ReadColor(archive,&this->m_mask_color), bVar1)) {
      bVar1 = ON_BinaryArchive::ReadDouble(archive,&this->m_border_offset);
    }
    else {
      bVar1 = false;
    }
    bVar2 = ON_BinaryArchive::EndRead3dmChunk(archive);
    return (bool)(bVar2 & bVar1);
  }
  return false;
}

Assistant:

bool ON_OBSOLETE_V5_TextExtra::Read(ON_BinaryArchive& archive)
{
  int major_version = 1;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if(!rc)
    return false;
  if(major_version != 1)
    return false;

  if(rc) rc = archive.ReadUuid(m_parent_uuid);
  if(rc) rc = archive.ReadBool(&m_bDrawMask);
  if(rc) rc = archive.ReadInt(&m_color_source);
  if(rc) rc = archive.ReadColor(m_mask_color);
  if(rc) rc = archive.ReadDouble(&m_border_offset);

  if ( !archive.EndRead3dmChunk() )
    rc = false;

  return rc;
}